

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  cpp *this_00;
  Options *options;
  char *format_00;
  MethodDescriptor *this_01;
  Formatter format;
  uint local_8c;
  string local_88;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->vars_)._M_t);
  format_00 = "const ::$proto_ns$::Message& $classname$::GetResponsePrototype(\n";
  if (which == REQUEST) {
    format_00 = "const ::$proto_ns$::Message& $classname$::GetRequestPrototype(\n";
  }
  Formatter::operator()<>(&local_68,format_00);
  Formatter::operator()<>
            (&local_68,
             "    const ::$proto_ns$::MethodDescriptor* method) const {\n  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n  switch(method->index()) {\n"
            );
  local_8c = 0;
  pSVar1 = this->descriptor_;
  if (0 < *(int *)(pSVar1 + 0x28)) {
    options = (Options *)0x0;
    do {
      this_01 = (MethodDescriptor *)((long)(int)options * 0x40 + *(long *)(pSVar1 + 0x20));
      if (which == REQUEST) {
        this_00 = (cpp *)MethodDescriptor::input_type(this_01);
      }
      else {
        this_00 = (cpp *)MethodDescriptor::output_type(this_01);
      }
      QualifiedClassName_abi_cxx11_(&local_88,this_00,(Descriptor *)this->options_,options);
      Formatter::operator()
                (&local_68,"    case $1$:\n      return $2$::default_instance();\n",(int *)&local_8c
                 ,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      local_8c = local_8c + 1;
      options = (Options *)(ulong)local_8c;
      pSVar1 = this->descriptor_;
    } while ((int)local_8c < *(int *)(pSVar1 + 0x28));
  }
  local_88._M_dataplus._M_p = "output";
  if (which == REQUEST) {
    local_88._M_dataplus._M_p = "input";
  }
  Formatter::operator()
            (&local_68,
             "    default:\n      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n      return *::$proto_ns$::MessageFactory::generated_factory()\n          ->GetPrototype(method->$1$_type());\n  }\n}\n\n"
             ,(char **)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  Formatter format(printer, vars_);
  if (which == REQUEST) {
    format("const ::$proto_ns$::Message& $classname$::GetRequestPrototype(\n");
  } else {
    format("const ::$proto_ns$::Message& $classname$::GetResponsePrototype(\n");
  }

  format(
      "    const ::$proto_ns$::MethodDescriptor* method) const {\n"
      "  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n"
      "  switch(method->index()) {\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    const Descriptor* type =
        (which == REQUEST) ? method->input_type() : method->output_type();

    format(
        "    case $1$:\n"
        "      return $2$::default_instance();\n",
        i, QualifiedClassName(type, options_));
  }

  format(
      "    default:\n"
      "      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n"
      "      return *::$proto_ns$::MessageFactory::generated_factory()\n"
      "          ->GetPrototype(method->$1$_type());\n"
      "  }\n"
      "}\n"
      "\n",
      which == REQUEST ? "input" : "output");
}